

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

int vorbis_decode_packet(vorb *f,int *len,int *p_left,int *p_right)

{
  Floor *pFVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int32 n;
  Floor *pFVar7;
  int16 *piVar8;
  float *pfVar9;
  short *psVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint32 uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  uint8 *puVar22;
  long lVar23;
  uint uVar24;
  byte *pbVar25;
  short sVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  float *a;
  float *pfVar36;
  uint uVar37;
  int iVar38;
  int iVar39;
  Codebook *pCVar40;
  long lVar41;
  ulong uVar42;
  bool bVar43;
  float fVar44;
  float fVar45;
  int n2;
  int right_end;
  int mode;
  int left_end;
  float *residue_buffers [16];
  int really_zero_channel [256];
  int zero_channel [256];
  int local_9d0;
  int local_9cc;
  int *local_9c8;
  int local_9bc;
  float *local_9b8 [16];
  uint8 local_938 [256];
  undefined4 local_838;
  int local_438 [258];
  
  iVar13 = vorbis_decode_initial(f,p_left,&local_9bc,p_right,&local_9d0,&local_9cc);
  if (iVar13 == 0) {
    return 0;
  }
  lVar21 = (long)local_9cc;
  iVar13 = *p_left;
  iVar20 = *p_right;
  iVar6 = f->blocksize[f->mode_config[lVar21].blockflag];
  puVar22 = f->mapping->submap_floor + ((ulong)((uint)f->mode_config[lVar21].mapping * 0x30) - 0x11)
  ;
  lVar29 = (long)f->channels;
  local_9c8 = p_left;
  if (0 < lVar29) {
    lVar41 = 0;
    do {
      bVar3 = *(byte *)(*(long *)(puVar22 + 8) + 2 + lVar41 * 3);
      local_438[lVar41] = 0;
      uVar42 = (ulong)puVar22[(ulong)bVar3 + 0x11];
      if (f->floor_types[uVar42] == 0) {
        f->error = VORBIS_invalid_stream;
        return 0;
      }
      pFVar7 = f->floor_config;
      uVar14 = get_bits(f,1);
      if (uVar14 == 0) {
LAB_0015dcb2:
        local_438[lVar41] = 1;
      }
      else {
        pFVar1 = pFVar7 + uVar42;
        n = *(int32 *)("" + (ulong)(pFVar1->floor1).floor1_multiplier * 4 + 0xc);
        piVar8 = f->finalY[lVar41];
        iVar15 = ilog(n);
        uVar14 = get_bits(f,iVar15 + -1);
        *piVar8 = (int16)uVar14;
        uVar14 = get_bits(f,iVar15 + -1);
        piVar8[1] = (int16)uVar14;
        if ((pFVar1->floor0).order != '\0') {
          lVar29 = 2;
          uVar32 = 0;
          do {
            bVar3 = *(byte *)((long)pFVar1 + uVar32 + 1);
            uVar33 = (ulong)bVar3;
            uVar17 = (uint)*(byte *)((long)pFVar1 + uVar33 + 0x21);
            bVar4 = *(byte *)((long)pFVar1 + uVar33 + 0x31);
            if (bVar4 == 0) {
              uVar30 = 0;
            }
            else {
              pCVar40 = f->codebooks + *(byte *)((long)pFVar1 + uVar33 + 0x41);
              if (f->valid_bits < 10) {
                if (f->valid_bits == 0) {
                  f->acc = 0;
                }
                do {
                  if (((f->last_seg != 0) && (f->bytes_in_seg == '\0')) ||
                     (iVar15 = get8_packet_raw(f), iVar15 == -1)) break;
                  iVar31 = f->valid_bits;
                  f->acc = f->acc + (iVar15 << ((byte)iVar31 & 0x1f));
                  f->valid_bits = iVar31 + 8;
                } while (iVar31 < 0x11);
              }
              sVar26 = pCVar40->fast_huffman[f->acc & 0x3ff];
              if (sVar26 < 0) {
                uVar30 = codebook_decode_scalar_raw(f,pCVar40);
              }
              else {
                bVar5 = pCVar40->codeword_lengths[(int)sVar26];
                f->acc = f->acc >> (bVar5 & 0x1f);
                iVar15 = f->valid_bits - (uint)bVar5;
                bVar43 = iVar15 < 0;
                if (iVar15 < 1) {
                  iVar15 = 0;
                }
                uVar30 = (int)sVar26;
                if (bVar43) {
                  uVar30 = 0xffffffff;
                }
                f->valid_bits = iVar15;
              }
              if (pCVar40->sparse != '\0') {
                uVar30 = pCVar40->sorted_values[(int)uVar30];
              }
            }
            if (uVar17 != 0) {
              lVar29 = (long)(int)lVar29;
              uVar37 = 0;
              do {
                lVar23 = (long)*(short *)((long)pFVar1 +
                                         (ulong)(uVar30 & ~(-1 << (bVar4 & 0x1f))) * 2 +
                                         (ulong)bVar3 * 0x10 + 0x52);
                uVar30 = (int)uVar30 >> (bVar4 & 0x1f);
                if (lVar23 < 0) {
                  iVar15 = 0;
                }
                else {
                  pCVar40 = f->codebooks + lVar23;
                  if (f->valid_bits < 10) {
                    if (f->valid_bits == 0) {
                      f->acc = 0;
                    }
                    do {
                      if (((f->last_seg != 0) && (f->bytes_in_seg == '\0')) ||
                         (iVar15 = get8_packet_raw(f), iVar15 == -1)) break;
                      iVar31 = f->valid_bits;
                      f->acc = f->acc + (iVar15 << ((byte)iVar31 & 0x1f));
                      f->valid_bits = iVar31 + 8;
                    } while (iVar31 < 0x11);
                  }
                  iVar15 = (int)pCVar40->fast_huffman[f->acc & 0x3ff];
                  if (pCVar40->fast_huffman[f->acc & 0x3ff] < 0) {
                    iVar15 = codebook_decode_scalar_raw(f,pCVar40);
                  }
                  else {
                    bVar5 = pCVar40->codeword_lengths[iVar15];
                    f->acc = f->acc >> (bVar5 & 0x1f);
                    iVar27 = f->valid_bits - (uint)bVar5;
                    iVar31 = iVar27;
                    if (iVar27 < 1) {
                      iVar31 = 0;
                    }
                    if (iVar27 < 0) {
                      iVar15 = -1;
                    }
                    f->valid_bits = iVar31;
                  }
                  if (pCVar40->sparse != '\0') {
                    iVar15 = pCVar40->sorted_values[iVar15];
                  }
                }
                piVar8[lVar29] = (int16)iVar15;
                lVar29 = lVar29 + 1;
                uVar37 = uVar37 + 1;
              } while (uVar37 != uVar17);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 < (pFVar1->floor0).order);
        }
        if (f->valid_bits == -1) goto LAB_0015dcb2;
        local_838._0_2_ = 0x101;
        iVar15 = (pFVar1->floor1).values;
        lVar29 = (long)iVar15;
        if (2 < lVar29) {
          lVar23 = 0;
          do {
            bVar3 = *(byte *)((long)pFVar7 + lVar23 * 2 + uVar42 * 0x63c + 0x444);
            bVar4 = *(byte *)((long)pFVar7 + lVar23 * 2 + uVar42 * 0x63c + 0x445);
            iVar27 = (int)*(short *)((long)piVar8 + (ulong)((uint)bVar3 + (uint)bVar3));
            iVar31 = (int)*(short *)((long)piVar8 + (ulong)((uint)bVar4 + (uint)bVar4));
            uVar37 = (uint)*(ushort *)((long)pFVar1 + (ulong)((uint)bVar3 + (uint)bVar3) + 0x152);
            uVar30 = iVar31 - iVar27;
            uVar17 = -uVar30;
            if (0 < (int)uVar30) {
              uVar17 = uVar30;
            }
            iVar16 = (int)((*(ushort *)((long)pFVar7 + lVar23 * 2 + uVar42 * 0x63c + 0x156) - uVar37
                           ) * (uVar17 & 0xffff)) /
                     (int)(*(ushort *)((long)pFVar1 + (ulong)((uint)bVar4 + (uint)bVar4) + 0x152) -
                          uVar37);
            iVar28 = -iVar16;
            if (-1 < iVar31 - iVar27) {
              iVar28 = iVar16;
            }
            iVar28 = iVar28 + iVar27;
            sVar26 = piVar8[lVar23 + 2];
            uVar17 = (uint)sVar26;
            if (uVar17 == 0) {
              *(undefined1 *)((long)&local_838 + lVar23 + 2) = 0;
LAB_0015dc67:
              sVar26 = (short)iVar28;
LAB_0015dc6c:
              piVar8[lVar23 + 2] = sVar26;
            }
            else {
              iVar27 = n - iVar28;
              iVar31 = iVar28;
              if (iVar27 < iVar28) {
                iVar31 = iVar27;
              }
              *(undefined1 *)((long)&local_838 + (ulong)bVar4) = 1;
              *(undefined1 *)((long)&local_838 + (ulong)bVar3) = 1;
              *(undefined1 *)((long)&local_838 + lVar23 + 2) = 1;
              if ((int)uVar17 < iVar31 * 2) {
                if ((uVar17 & 1) == 0) {
                  iVar28 = iVar28 + (uVar17 >> 1);
                }
                else {
                  iVar28 = iVar28 - (uVar17 + 1 >> 1);
                }
                goto LAB_0015dc67;
              }
              if (iVar27 <= iVar28) {
                sVar26 = ((short)iVar28 - sVar26) + (short)iVar27 + -1;
                goto LAB_0015dc6c;
              }
            }
            lVar23 = lVar23 + 1;
          } while (lVar29 + -2 != lVar23);
        }
        if (0 < iVar15) {
          lVar23 = 0;
          do {
            if (*(char *)((long)&local_838 + lVar23) == '\0') {
              piVar8[lVar23] = -1;
            }
            lVar23 = lVar23 + 1;
          } while (lVar29 != lVar23);
        }
      }
      lVar41 = lVar41 + 1;
      lVar29 = (long)f->channels;
    } while (lVar41 < lVar29);
  }
  memcpy(&local_838,local_438,lVar29 << 2);
  uVar42 = (ulong)*(ushort *)puVar22;
  if (uVar42 != 0) {
    lVar29 = *(long *)(puVar22 + 8);
    lVar41 = 0;
    do {
      bVar3 = *(byte *)(lVar29 + lVar41);
      if (local_438[bVar3] == 0) {
        uVar32 = (ulong)*(byte *)(lVar29 + 1 + lVar41);
LAB_0015dd32:
        local_438[uVar32] = 0;
        local_438[bVar3] = 0;
      }
      else {
        uVar32 = (ulong)*(byte *)(lVar29 + 1 + lVar41);
        if (local_438[uVar32] == 0) goto LAB_0015dd32;
      }
      lVar41 = lVar41 + 3;
    } while (uVar42 * 3 != lVar41);
  }
  uVar17 = iVar6 >> 1;
  if (puVar22[0x10] != '\0') {
    uVar42 = 0;
    do {
      iVar15 = f->channels;
      iVar31 = 0;
      if (0 < (long)iVar15) {
        pbVar25 = (byte *)(*(long *)(puVar22 + 8) + 2);
        lVar29 = 0;
        iVar31 = 0;
        do {
          if (uVar42 == *pbVar25) {
            if (local_438[lVar29] == 0) {
              pfVar36 = f->channel_buffers[lVar29];
            }
            else {
              pfVar36 = (float *)0x0;
            }
            local_938[iVar31] = local_438[lVar29] != 0;
            local_9b8[iVar31] = pfVar36;
            iVar31 = iVar31 + 1;
          }
          lVar29 = lVar29 + 1;
          pbVar25 = pbVar25 + 3;
        } while (iVar15 != lVar29);
      }
      decode_residue(f,local_9b8,iVar31,uVar17,(uint)puVar22[uVar42 + 0x20],local_938);
      uVar42 = uVar42 + 1;
    } while (uVar42 < puVar22[0x10]);
    uVar42 = (ulong)*(ushort *)puVar22;
  }
  if ((short)uVar42 != 0) {
    lVar29 = *(long *)(puVar22 + 8);
    do {
      if (0 < (int)uVar17) {
        lVar41 = (uVar42 - 1) * 3;
        pfVar36 = f->channel_buffers[*(byte *)(lVar29 + lVar41)];
        pfVar9 = f->channel_buffers[*(byte *)(lVar29 + 1 + lVar41)];
        uVar32 = 0;
        do {
          fVar45 = pfVar36[uVar32];
          fVar2 = pfVar9[uVar32];
          fVar44 = fVar45;
          if (fVar45 <= 0.0) {
            if (fVar2 <= 0.0) {
              fVar44 = fVar45 - fVar2;
            }
            else {
              fVar45 = fVar2 + fVar45;
            }
          }
          else if (fVar2 <= 0.0) {
            fVar44 = fVar2 + fVar45;
          }
          else {
            fVar45 = fVar45 - fVar2;
          }
          pfVar36[uVar32] = fVar44;
          pfVar9[uVar32] = fVar45;
          uVar32 = uVar32 + 1;
        } while (uVar17 != uVar32);
      }
      bVar43 = 1 < (long)uVar42;
      uVar42 = uVar42 - 1;
    } while (bVar43);
  }
  iVar15 = f->channels;
  if (0 < iVar15) {
    lVar29 = 0;
    do {
      pfVar36 = f->channel_buffers[lVar29];
      if ((&local_838)[lVar29] == 0) {
        if (f->floor_types
            [puVar22[(ulong)*(byte *)(*(long *)(puVar22 + 8) + 2 + lVar29 * 3) + 0x11]] == 0) {
          f->error = VORBIS_invalid_stream;
        }
        else {
          psVar10 = f->finalY[lVar29];
          pFVar7 = f->floor_config;
          lVar41 = (ulong)puVar22[(ulong)*(byte *)(*(long *)(puVar22 + 8) + 2 + lVar29 * 3) + 0x11]
                   * 0x63c;
          bVar3 = *(byte *)((long)pFVar7 + lVar41 + 0x634);
          uVar37 = (int)*psVar10 * (uint)bVar3;
          lVar23 = (long)*(int *)((long)pFVar7 + lVar41 + 0x638);
          uVar30 = 0;
          if (1 < lVar23) {
            uVar30 = 0;
            lVar35 = 1;
            do {
              uVar42 = (ulong)*(byte *)((long)pFVar7 + lVar35 + lVar41 + 0x346);
              sVar26 = psVar10[uVar42];
              uVar24 = uVar37;
              uVar12 = uVar30;
              if (-1 < sVar26) {
                uVar24 = (int)sVar26 * (uint)bVar3;
                uVar18 = (uint)*(ushort *)((long)pFVar7 + uVar42 * 2 + lVar41 + 0x152);
                iVar31 = uVar18 - uVar30;
                if (iVar31 != 0) {
                  iVar28 = uVar24 - uVar37;
                  iVar27 = -iVar28;
                  if (0 < iVar28) {
                    iVar27 = iVar28;
                  }
                  iVar19 = iVar28 / iVar31;
                  iVar16 = -iVar19;
                  if (0 < iVar19) {
                    iVar16 = iVar19;
                  }
                  uVar11 = uVar17;
                  if ((int)uVar18 < (int)uVar17) {
                    uVar11 = uVar18;
                  }
                  uVar12 = uVar18;
                  if ((int)uVar30 < (int)uVar11) {
                    pfVar36[uVar30] = inverse_db_table[uVar37 & 0xff] * pfVar36[uVar30];
                    if ((int)(uVar30 + 1) < (int)uVar11) {
                      iVar38 = 0;
                      lVar34 = 1;
                      do {
                        iVar38 = iVar38 + (iVar27 - iVar16 * iVar31);
                        uVar18 = 0;
                        iVar39 = 0;
                        if (iVar31 <= iVar38) {
                          uVar18 = iVar28 >> 0x1f | 1;
                          iVar39 = iVar31;
                        }
                        uVar37 = uVar37 + iVar19 + uVar18;
                        iVar38 = iVar38 - iVar39;
                        pfVar36[(ulong)uVar30 + lVar34] =
                             inverse_db_table[uVar37 & 0xff] * pfVar36[(ulong)uVar30 + lVar34];
                        lVar34 = lVar34 + 1;
                      } while (uVar11 - uVar30 != (int)lVar34);
                    }
                  }
                }
              }
              uVar30 = uVar12;
              uVar37 = uVar24;
              lVar35 = lVar35 + 1;
            } while (lVar35 != lVar23);
          }
          if ((int)uVar30 < (int)uVar17) {
            fVar45 = inverse_db_table[(int)uVar37];
            uVar42 = (ulong)uVar30;
            do {
              pfVar36[uVar42] = pfVar36[uVar42] * fVar45;
              uVar42 = uVar42 + 1;
            } while ((long)(int)uVar17 != uVar42);
          }
        }
      }
      else {
        memset(pfVar36,0,(long)(int)uVar17 * 4);
        iVar15 = f->channels;
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 < iVar15);
    if (0 < iVar15) {
      lVar29 = 0;
      do {
        inverse_mdct(f->channel_buffers[lVar29],iVar6,f,(uint)f->mode_config[lVar21].blockflag);
        lVar29 = lVar29 + 1;
      } while (lVar29 < f->channels);
    }
  }
  do {
    iVar15 = get8_packet_raw(f);
  } while (iVar15 != -1);
  if (f->first_decode == '\0') {
    iVar6 = f->discard_samples_deferred;
    if (iVar6 != 0) {
      if (iVar6 < iVar20 - iVar13) {
        *local_9c8 = iVar13 + iVar6;
        f->discard_samples_deferred = 0;
        iVar13 = iVar13 + iVar6;
      }
      else {
        f->discard_samples_deferred = iVar6 - (iVar20 - iVar13);
        *local_9c8 = iVar20;
        iVar13 = iVar20;
      }
    }
  }
  else {
    f->current_loc = -uVar17;
    f->discard_samples_deferred = iVar6 - local_9d0;
    f->current_loc_valid = 1;
    f->first_decode = '\0';
  }
  if (f->last_seg_which == f->end_seg_with_known_loc) {
    if ((f->current_loc_valid != 0) && ((f->page_flag & 4) != 0)) {
      uVar30 = f->current_loc;
      uVar37 = f->known_loc_for_packet;
      if (uVar37 < (local_9d0 - iVar13) + uVar30) {
        iVar20 = uVar37 - uVar30;
        if (uVar37 < uVar30) {
          iVar20 = 0;
        }
        iVar6 = iVar20 + iVar13;
        if (local_9d0 <= iVar20 + iVar13) {
          iVar6 = local_9d0;
        }
        *len = iVar6;
        f->current_loc = f->current_loc + iVar6;
        return 1;
      }
    }
    uVar14 = (iVar13 - uVar17) + f->known_loc_for_packet;
    f->current_loc_valid = 1;
  }
  else {
    if (f->current_loc_valid == 0) goto LAB_0015e2d7;
    uVar14 = f->current_loc;
  }
  f->current_loc = (iVar20 - iVar13) + uVar14;
LAB_0015e2d7:
  *len = local_9d0;
  return 1;
}

Assistant:

static int vorbis_decode_packet(vorb *f, int *len, int *p_left, int *p_right)
{
   int mode, left_end, right_end;
   if (!vorbis_decode_initial(f, p_left, &left_end, p_right, &right_end, &mode)) return 0;
   return vorbis_decode_packet_rest(f, len, f->mode_config + mode, *p_left, left_end, *p_right, right_end, p_left);
}